

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                    *this,TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                          *cp)

{
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *unaff_retaddr;
  TPZStack<TPZEqnArray<std::complex<double>_>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>>
            (in_RDI,0x21);
  TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  ::TPZFrontMatrix(unaff_retaddr,(void **)vtt,in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02554f60;
  TPZStack<TPZEqnArray<std::complex<double>_>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x2c0) = 0;
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x2d0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  std::mutex::mutex((mutex *)0x1d48ae3);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2f0));
  TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10>::Resize
            ((TPZManVector<TPZEqnArray<std::complex<double>_>_*,_10> *)in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}